

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int get_lvalue(JSParseState *s,int *popcode,int *pscope,JSAtom *pname,int *plabel,int *pdepth,
              BOOL keep,int tok)

{
  JSFunctionDef *fd_00;
  uint32_t *in_RCX;
  uint32_t *in_RDX;
  int *in_RSI;
  JSParseState *in_RDI;
  int *in_R8;
  undefined4 *in_R9;
  int in_stack_00000008;
  int in_stack_00000010;
  JSAtom name;
  int depth;
  int label;
  int scope;
  int opcode;
  JSFunctionDef *fd;
  JSAtom in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int iVar1;
  uint32_t uVar2;
  uint8_t val;
  undefined4 uVar3;
  int iVar4;
  uint32_t local_48;
  int local_44;
  
  fd_00 = in_RDI->cur_func;
  local_48 = 0;
  uVar2 = 0;
  iVar4 = -1;
  local_44 = get_prev_opcode(fd_00);
  if (local_44 == 0x41) {
    uVar2 = get_u32((fd_00->byte_code).buf + (long)fd_00->last_opcode_pos + 1);
    uVar3 = 1;
  }
  else if (local_44 == 0x47) {
    uVar3 = 2;
  }
  else if (local_44 == 0x4a) {
    uVar3 = 3;
  }
  else if (local_44 == 0xb6) {
    uVar2 = get_u32((fd_00->byte_code).buf + (long)fd_00->last_opcode_pos + 1);
    local_48 = get_u16((fd_00->byte_code).buf + (long)fd_00->last_opcode_pos + 5);
    if (((uVar2 == 0x4d) || (uVar2 == 0x3a)) && ((fd_00->js_mode & 1) != 0)) {
      iVar4 = js_parse_error(in_RDI,"invalid lvalue in strict mode");
      return iVar4;
    }
    if ((uVar2 == 8) || (uVar2 == 0x71)) goto LAB_00195052;
    uVar3 = 2;
  }
  else {
    if (local_44 != 0xbc) {
LAB_00195052:
      if (in_stack_00000010 == -0x45) {
        iVar4 = js_parse_error(in_RDI,"invalid for in/of left hand-side");
        return iVar4;
      }
      if ((in_stack_00000010 != -0x6b) && (in_stack_00000010 != -0x6c)) {
        if ((in_stack_00000010 != 0x5b) && (in_stack_00000010 != 0x7b)) {
          iVar4 = js_parse_error(in_RDI,"invalid assignment left-hand side");
          return iVar4;
        }
        iVar4 = js_parse_error(in_RDI,"invalid destructuring target");
        return iVar4;
      }
      iVar4 = js_parse_error(in_RDI,"invalid increment/decrement operand");
      return iVar4;
    }
    uVar2 = get_u32((fd_00->byte_code).buf + (long)fd_00->last_opcode_pos + 1);
    local_48 = get_u16((fd_00->byte_code).buf + (long)fd_00->last_opcode_pos + 5);
    uVar3 = 1;
  }
  (fd_00->byte_code).size = (long)fd_00->last_opcode_pos;
  fd_00->last_opcode_pos = -1;
  val = (uint8_t)(uVar2 >> 0x18);
  if (in_stack_00000008 == 0) {
    if (local_44 == 0x47) {
      emit_op((JSParseState *)CONCAT44(iVar4,uVar3),val);
    }
    else if (local_44 == 0x4a) {
      emit_op((JSParseState *)CONCAT44(iVar4,uVar3),val);
    }
    else if (local_44 == 0xb6) {
      iVar4 = new_label((JSParseState *)0x1952d9);
      emit_op((JSParseState *)CONCAT44(iVar4,uVar3),(uint8_t)(uVar2 >> 0x18));
      emit_atom((JSParseState *)CONCAT44(in_stack_ffffffffffffffa4,local_44),
                in_stack_ffffffffffffff9c);
      emit_u32((JSParseState *)CONCAT44(in_stack_ffffffffffffffa4,local_44),
               in_stack_ffffffffffffff9c);
      emit_u16((JSParseState *)CONCAT44(in_stack_ffffffffffffffa4,local_44),
               (uint16_t)(in_stack_ffffffffffffff9c >> 0x10));
      update_label(fd_00,iVar4,1);
      local_44 = 0x3c;
    }
  }
  else if (local_44 == 0x41) {
    iVar1 = local_44;
    emit_op((JSParseState *)CONCAT44(iVar4,uVar3),val);
    emit_atom((JSParseState *)CONCAT44(iVar1,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c);
  }
  else if (local_44 == 0x47) {
    emit_op((JSParseState *)CONCAT44(iVar4,uVar3),val);
    emit_op((JSParseState *)CONCAT44(iVar4,uVar3),(uint8_t)(uVar2 >> 0x18));
    emit_op((JSParseState *)CONCAT44(iVar4,uVar3),(uint8_t)(uVar2 >> 0x18));
  }
  else if (local_44 == 0x4a) {
    emit_op((JSParseState *)CONCAT44(iVar4,uVar3),val);
    emit_op((JSParseState *)CONCAT44(iVar4,uVar3),(uint8_t)(uVar2 >> 0x18));
    emit_op((JSParseState *)CONCAT44(iVar4,uVar3),(uint8_t)(uVar2 >> 0x18));
  }
  else if (local_44 == 0xb6) {
    iVar4 = new_label((JSParseState *)0x195173);
    emit_op((JSParseState *)CONCAT44(iVar4,uVar3),(uint8_t)(uVar2 >> 0x18));
    emit_atom((JSParseState *)CONCAT44(local_44,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c
             );
    emit_u32((JSParseState *)CONCAT44(local_44,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c)
    ;
    emit_u16((JSParseState *)CONCAT44(local_44,in_stack_ffffffffffffffa0),
             (uint16_t)(in_stack_ffffffffffffff9c >> 0x10));
    update_label(fd_00,iVar4,1);
    emit_op((JSParseState *)CONCAT44(iVar4,uVar3),(uint8_t)(uVar2 >> 0x18));
    local_44 = 0x3c;
  }
  else {
    if (local_44 != 0xbc) {
      abort();
    }
    iVar1 = local_44;
    emit_op((JSParseState *)CONCAT44(iVar4,uVar3),val);
    emit_atom((JSParseState *)CONCAT44(iVar1,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c);
    emit_u16((JSParseState *)CONCAT44(iVar1,in_stack_ffffffffffffffa0),
             (uint16_t)(in_stack_ffffffffffffff9c >> 0x10));
  }
  *in_RSI = local_44;
  *in_RDX = local_48;
  *in_RCX = uVar2;
  *in_R8 = iVar4;
  if (in_R9 != (undefined4 *)0x0) {
    *in_R9 = uVar3;
  }
  return 0;
}

Assistant:

static __exception int get_lvalue(JSParseState *s, int *popcode, int *pscope,
                                  JSAtom *pname, int *plabel, int *pdepth, BOOL keep,
                                  int tok)
{
    JSFunctionDef *fd;
    int opcode, scope, label, depth;
    JSAtom name;

    /* we check the last opcode to get the lvalue type */
    fd = s->cur_func;
    scope = 0;
    name = JS_ATOM_NULL;
    label = -1;
    depth = 0;
    switch(opcode = get_prev_opcode(fd)) {
    case OP_scope_get_var:
        name = get_u32(fd->byte_code.buf + fd->last_opcode_pos + 1);
        scope = get_u16(fd->byte_code.buf + fd->last_opcode_pos + 5);
        if ((name == JS_ATOM_arguments || name == JS_ATOM_eval) &&
            (fd->js_mode & JS_MODE_STRICT)) {
            return js_parse_error(s, "invalid lvalue in strict mode");
        }
        if (name == JS_ATOM_this || name == JS_ATOM_new_target)
            goto invalid_lvalue;
        depth = 2;  /* will generate OP_get_ref_value */
        break;
    case OP_get_field:
        name = get_u32(fd->byte_code.buf + fd->last_opcode_pos + 1);
        depth = 1;
        break;
    case OP_scope_get_private_field:
        name = get_u32(fd->byte_code.buf + fd->last_opcode_pos + 1);
        scope = get_u16(fd->byte_code.buf + fd->last_opcode_pos + 5);
        depth = 1;
        break;
    case OP_get_array_el:
        depth = 2;
        break;
    case OP_get_super_value:
        depth = 3;
        break;
    default:
    invalid_lvalue:
        if (tok == TOK_FOR) {
            return js_parse_error(s, "invalid for in/of left hand-side");
        } else if (tok == TOK_INC || tok == TOK_DEC) {
            return js_parse_error(s, "invalid increment/decrement operand");
        } else if (tok == '[' || tok == '{') {
            return js_parse_error(s, "invalid destructuring target");
        } else {
            return js_parse_error(s, "invalid assignment left-hand side");
        }
    }
    /* remove the last opcode */
    fd->byte_code.size = fd->last_opcode_pos;
    fd->last_opcode_pos = -1;

    if (keep) {
        /* get the value but keep the object/fields on the stack */
        switch(opcode) {
        case OP_scope_get_var:
            label = new_label(s);
            emit_op(s, OP_scope_make_ref);
            emit_atom(s, name);
            emit_u32(s, label);
            emit_u16(s, scope);
            update_label(fd, label, 1);
            emit_op(s, OP_get_ref_value);
            opcode = OP_get_ref_value;
            break;
        case OP_get_field:
            emit_op(s, OP_get_field2);
            emit_atom(s, name);
            break;
        case OP_scope_get_private_field:
            emit_op(s, OP_scope_get_private_field2);
            emit_atom(s, name);
            emit_u16(s, scope);
            break;
        case OP_get_array_el:
            /* XXX: replace by a single opcode ? */
            emit_op(s, OP_to_propkey2);
            emit_op(s, OP_dup2);
            emit_op(s, OP_get_array_el);
            break;
        case OP_get_super_value:
            emit_op(s, OP_to_propkey);
            emit_op(s, OP_dup3);
            emit_op(s, OP_get_super_value);
            break;
        default:
            abort();
        }
    } else {
        switch(opcode) {
        case OP_scope_get_var:
            label = new_label(s);
            emit_op(s, OP_scope_make_ref);
            emit_atom(s, name);
            emit_u32(s, label);
            emit_u16(s, scope);
            update_label(fd, label, 1);
            opcode = OP_get_ref_value;
            break;
        case OP_get_array_el:
            emit_op(s, OP_to_propkey2);
            break;
        case OP_get_super_value:
            emit_op(s, OP_to_propkey);
            break;
        }
    }

    *popcode = opcode;
    *pscope = scope;
    /* name has refcount for OP_get_field and OP_get_ref_value,
       and JS_ATOM_NULL for other opcodes */
    *pname = name;
    *plabel = label;
    if (pdepth)
        *pdepth = depth;
    return 0;
}